

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O2

int jpc_dec_process_siz(jpc_dec_t *dec,jpc_ms_t *ms)

{
  uint uVar1;
  jpc_sizcomp_t *pjVar2;
  uint_fast32_t uVar3;
  uint_fast32_t uVar4;
  uint_fast32_t uVar5;
  uint_fast32_t uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  jpc_dec_cp_t *pjVar18;
  jpc_dec_cmpt_t *pjVar19;
  ulong uVar20;
  ulong uVar21;
  jpc_dec_tile_t *pjVar22;
  jpc_dec_tcomp_t *pjVar23;
  uint_fast32_t *puVar24;
  jpc_dec_tile_t *pjVar25;
  int iVar26;
  ulong uVar27;
  char *fmt;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  bool bVar32;
  
  uVar30 = (ms->parms).sot.len;
  uVar31 = (ms->parms).siz.height;
  if (((uVar30 == 0) ||
      (auVar11._8_8_ = 0, auVar11._0_8_ = uVar30, auVar14._8_8_ = 0, auVar14._0_8_ = uVar31,
      SUB168(auVar11 * auVar14,8) == 0)) &&
     ((uVar27 = dec->max_samples, uVar27 == 0 ||
      (uVar31 * uVar30 < uVar27 || uVar31 * uVar30 - uVar27 == 0)))) {
    uVar20 = (ms->parms).siz.tilewidth;
    uVar21 = (ms->parms).siz.tileheight;
    if (((uVar20 != 0) &&
        (auVar12._8_8_ = 0, auVar12._0_8_ = uVar20, auVar15._8_8_ = 0, auVar15._0_8_ = uVar21,
        SUB168(auVar12 * auVar15,8) != 0)) ||
       ((uVar27 != 0 && (uVar27 <= uVar21 * uVar20 && uVar21 * uVar20 - uVar27 != 0)))) {
      fmt = "tile too large\n";
      goto LAB_0011ce72;
    }
    uVar3 = (ms->parms).siz.yoff;
    dec->xstart = (ms->parms).siz.xoff;
    dec->ystart = uVar3;
    dec->xend = uVar30;
    dec->yend = uVar31;
    dec->tilewidth = uVar20;
    dec->tileheight = uVar21;
    uVar3 = (ms->parms).siz.tileyoff;
    dec->tilexoff = (ms->parms).siz.tilexoff;
    dec->tileyoff = uVar3;
    iVar17 = (int)(ms->parms).siz.numcomps;
    dec->numcomps = iVar17;
    pjVar18 = jpc_dec_cp_create((long)iVar17);
    dec->cp = pjVar18;
    if (pjVar18 == (jpc_dec_cp_t *)0x0) {
      return -1;
    }
    pjVar19 = (jpc_dec_cmpt_t *)jas_alloc2((long)dec->numcomps,0x40);
    dec->cmpts = pjVar19;
    if (pjVar19 == (jpc_dec_cmpt_t *)0x0) {
      return -1;
    }
    uVar1 = dec->numcomps;
    uVar30 = 0;
    uVar31 = 0;
    if (0 < (int)uVar1) {
      uVar31 = (ulong)uVar1;
    }
    puVar24 = &pjVar19->hsubstep;
    uVar27 = 0;
    while( true ) {
      if (uVar31 == uVar30) {
        uVar30 = dec->max_samples;
        if ((uVar30 != 0) && (uVar30 < uVar27)) {
          jas_eprintf("maximum number of samples exceeded (%zu > %zu)\n",uVar27,uVar30);
          return -1;
        }
        dec->image = (jas_image_t *)0x0;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = dec->tilewidth;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = ~dec->tilexoff + dec->xend + dec->tilewidth;
        uVar31 = SUB168(auVar9 / auVar7,0);
        iVar26 = SUB164(auVar9 / auVar7,0);
        dec->numhtiles = iVar26;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = dec->tileheight;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = ~dec->tileyoff + dec->yend + dec->tileheight;
        iVar17 = SUB164(auVar10 / auVar8,0);
        dec->numvtiles = iVar17;
        if (iVar26 < 0) {
          __assert_fail("dec->numhtiles >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                        ,0x534,"int jpc_dec_process_siz(jpc_dec_t *, jpc_ms_t *)");
        }
        if (iVar17 < 0) {
          __assert_fail("dec->numvtiles >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                        ,0x535,"int jpc_dec_process_siz(jpc_dec_t *, jpc_ms_t *)");
        }
        uVar27 = (SUB168(auVar10 / auVar8,0) & 0x7fffffff) * (uVar31 & 0x7fffffff);
        if (0x7fffffff < uVar27) {
          return -1;
        }
        if ((uVar30 != 0) && (uVar30 >> 8 <= uVar27 && uVar27 - (uVar30 >> 8) != 0)) {
          return -1;
        }
        if ((uVar30 != 0) &&
           (uVar30 = uVar30 / (ulong)(long)(int)uVar1 >> 4, uVar30 <= uVar27 && uVar27 - uVar30 != 0
           )) {
          return -1;
        }
        dec->numtiles = (int)uVar27;
        iVar17 = jas_getdbglevel();
        if (9 < iVar17) {
          jas_eprintf("numtiles = %d; numhtiles = %d; numvtiles = %d;\n",uVar27 & 0xffffffff,
                      uVar31 & 0xffffffff);
          uVar27 = (ulong)(uint)dec->numtiles;
        }
        pjVar22 = (jpc_dec_tile_t *)jas_alloc2((long)(int)uVar27,0x68);
        dec->tiles = pjVar22;
        if (pjVar22 == (jpc_dec_tile_t *)0x0) {
          return -1;
        }
        iVar17 = dec->numtiles;
        pjVar25 = pjVar22;
        iVar26 = 0;
        if (0 < iVar17) {
          iVar26 = iVar17;
        }
        while (iVar26 != 0) {
          pjVar25->state = 3;
          pjVar25 = pjVar25 + 1;
          iVar26 = iVar26 + -1;
        }
        iVar26 = 0;
        while( true ) {
          if (iVar17 <= iVar26) {
            dec->pkthdrstreams = (jpc_streamlist_t *)0x0;
            dec->state = 4;
            return 0;
          }
          iVar17 = iVar26 / dec->numhtiles;
          uVar30 = (long)iVar26 % (long)dec->numhtiles;
          pjVar22->realmode = 0;
          pjVar22->state = 0;
          uVar3 = dec->tilexoff;
          uVar4 = dec->tilewidth;
          uVar31 = uVar4 * (uVar30 & 0xffffffff) + uVar3;
          if (uVar31 <= dec->xstart) {
            uVar31 = dec->xstart;
          }
          pjVar22->xstart = uVar31;
          uVar5 = dec->tileyoff;
          uVar6 = dec->tileheight;
          uVar31 = uVar6 * (long)iVar17 + uVar5;
          if (uVar31 <= dec->ystart) {
            uVar31 = dec->ystart;
          }
          pjVar22->ystart = uVar31;
          uVar30 = ((int)uVar30 + 1) * uVar4 + uVar3;
          if (dec->xend <= uVar30) {
            uVar30 = dec->xend;
          }
          pjVar22->xend = uVar30;
          uVar30 = (long)(iVar17 + 1) * uVar6 + uVar5;
          if (dec->yend <= uVar30) {
            uVar30 = dec->yend;
          }
          pjVar22->yend = uVar30;
          pjVar22->partno = 0;
          pjVar22->numparts = 0;
          pjVar22->pi = (jpc_pi_t *)0x0;
          pjVar22->pptstab = (jpc_ppxstab_t *)0x0;
          pjVar22->pkthdrstream = (jas_stream_t *)0x0;
          pjVar22->pkthdrstreampos = 0;
          pjVar22->cp = (jpc_dec_cp_t *)0x0;
          pjVar23 = (jpc_dec_tcomp_t *)jas_alloc2((long)dec->numcomps,0x40);
          pjVar22->tcomps = pjVar23;
          if (pjVar23 == (jpc_dec_tcomp_t *)0x0) break;
          pjVar19 = dec->cmpts;
          iVar17 = dec->numcomps;
          if (dec->numcomps < 1) {
            iVar17 = 0;
          }
          lVar29 = 0;
          while (bVar32 = iVar17 != 0, iVar17 = iVar17 + -1, bVar32) {
            *(undefined8 *)((long)&pjVar23->rlvls + lVar29) = 0;
            *(undefined4 *)((long)&pjVar23->numrlvls + lVar29) = 0;
            *(undefined8 *)((long)&pjVar23->data + lVar29) = 0;
            uVar30 = *(ulong *)((long)&pjVar19->hstep + lVar29);
            *(ulong *)((long)&pjVar23->xstart + lVar29) = (pjVar22->xstart + (uVar30 - 1)) / uVar30;
            uVar31 = *(ulong *)((long)&pjVar19->vstep + lVar29);
            *(ulong *)((long)&pjVar23->ystart + lVar29) = (pjVar22->ystart + (uVar31 - 1)) / uVar31;
            *(ulong *)((long)&pjVar23->xend + lVar29) = ((uVar30 - 1) + pjVar22->xend) / uVar30;
            *(ulong *)((long)&pjVar23->yend + lVar29) = ((uVar31 - 1) + pjVar22->yend) / uVar31;
            *(undefined8 *)((long)&pjVar23->tsfb + lVar29) = 0;
            lVar29 = lVar29 + 0x40;
          }
          iVar26 = iVar26 + 1;
          pjVar22 = pjVar22 + 1;
          iVar17 = dec->numtiles;
        }
        return -1;
      }
      pjVar2 = (ms->parms).siz.comps;
      puVar24[-2] = (ulong)pjVar2[uVar30].prec;
      *(bool *)(puVar24 + -1) = pjVar2[uVar30].sgnd != '\0';
      uVar21 = (ulong)pjVar2[uVar30].hsamp;
      ((jpc_dec_cmpt_t *)(puVar24 + -6))->hstep = uVar21;
      uVar28 = (ulong)pjVar2[uVar30].vsamp;
      puVar24[-5] = uVar28;
      uVar20 = (dec->xend + (uVar21 - 1)) / uVar21;
      uVar21 = ((uVar21 - 1) + dec->xstart) / uVar21;
      puVar24[-4] = uVar20 - uVar21;
      uVar28 = (dec->yend + (uVar28 - 1)) / uVar28 - ((uVar28 - 1) + dec->ystart) / uVar28;
      puVar24[-3] = uVar28;
      *puVar24 = 0;
      puVar24[1] = 0;
      uVar20 = uVar20 - uVar21;
      if (((uVar20 != 0) &&
          (auVar13._8_8_ = 0, auVar13._0_8_ = uVar20, auVar16._8_8_ = 0, auVar16._0_8_ = uVar28,
          SUB168(auVar13 * auVar16,8) != 0)) ||
         (bVar32 = CARRY8(uVar27,uVar28 * uVar20), uVar27 = uVar27 + uVar28 * uVar20, bVar32))
      break;
      uVar30 = uVar30 + 1;
      puVar24 = puVar24 + 8;
    }
  }
  fmt = "image too large\n";
LAB_0011ce72:
  jas_eprintf(fmt);
  return -1;
}

Assistant:

static int jpc_dec_process_siz(jpc_dec_t *dec, jpc_ms_t *ms)
{
	jpc_siz_t *siz = &ms->parms.siz;
	int compno;
	int tileno;
	jpc_dec_tile_t *tile;
	jpc_dec_tcomp_t *tcomp;
	int htileno;
	int vtileno;
	jpc_dec_cmpt_t *cmpt;
	size_t size;
	size_t num_samples;
	size_t num_samples_delta;

	size_t total_samples;
	if (!jas_safe_size_mul(siz->width, siz->height, &total_samples) ||
	    (dec->max_samples > 0 && total_samples > dec->max_samples)) {
		jas_eprintf("image too large\n");
		return -1;
	}

	size_t tile_samples;
	if (!jas_safe_size_mul(siz->tilewidth, siz->tileheight, &tile_samples) ||
	    (dec->max_samples > 0 && tile_samples > dec->max_samples)) {
		jas_eprintf("tile too large\n");
		return -1;
	}

	dec->xstart = siz->xoff;
	dec->ystart = siz->yoff;
	dec->xend = siz->width;
	dec->yend = siz->height;
	dec->tilewidth = siz->tilewidth;
	dec->tileheight = siz->tileheight;
	dec->tilexoff = siz->tilexoff;
	dec->tileyoff = siz->tileyoff;
	dec->numcomps = siz->numcomps;

	if (!(dec->cp = jpc_dec_cp_create(dec->numcomps))) {
		return -1;
	}

	if (!(dec->cmpts = jas_alloc2(dec->numcomps, sizeof(jpc_dec_cmpt_t)))) {
		return -1;
	}

	num_samples = 0;
	for (compno = 0, cmpt = dec->cmpts; compno < dec->numcomps; ++compno,
	  ++cmpt) {
		cmpt->prec = siz->comps[compno].prec;
		cmpt->sgnd = siz->comps[compno].sgnd;
		cmpt->hstep = siz->comps[compno].hsamp;
		cmpt->vstep = siz->comps[compno].vsamp;
		cmpt->width = JPC_CEILDIV(dec->xend, cmpt->hstep) -
		  JPC_CEILDIV(dec->xstart, cmpt->hstep);
		cmpt->height = JPC_CEILDIV(dec->yend, cmpt->vstep) -
		  JPC_CEILDIV(dec->ystart, cmpt->vstep);
		cmpt->hsubstep = 0;
		cmpt->vsubstep = 0;

		if (!jas_safe_size_mul(cmpt->width, cmpt->height, &num_samples_delta)) {
			jas_eprintf("image too large\n");
			return -1;
		}
		if (!jas_safe_size_add(num_samples, num_samples_delta, &num_samples)) {
			jas_eprintf("image too large\n");
			return -1;
		}
	}

	if (dec->max_samples > 0 && num_samples > dec->max_samples) {
		jas_eprintf("maximum number of samples exceeded (%zu > %zu)\n",
		  num_samples, dec->max_samples);
		return -1;
	}

	dec->image = 0;

	dec->numhtiles = JPC_CEILDIV(dec->xend - dec->tilexoff, dec->tilewidth);
	dec->numvtiles = JPC_CEILDIV(dec->yend - dec->tileyoff, dec->tileheight);
	assert(dec->numhtiles >= 0);
	assert(dec->numvtiles >= 0);
	if (!jas_safe_size_mul(dec->numhtiles, dec->numvtiles, &size) ||
	  size > INT_MAX) {
		return -1;
	}
	if (dec->max_samples > 0 && size > dec->max_samples / 16 / 16) {
		/* avoid Denial of Service by a malicious input file
		   with millions of tiny tiles; if max_samples is
		   configured, then assume the tiles are at least
		   16x16, and don't allow more than this number of
		   tiles */
		return -1;
	}
	if (dec->max_samples > 0 && size > dec->max_samples / dec->numcomps / 16) {
		/* another DoS check: since each tile allocates an
		   array of components, this check attempts to catch
		   excessive tile*component numbers */
		return -1;
	}
	dec->numtiles = size;
	JAS_DBGLOG(10, ("numtiles = %d; numhtiles = %d; numvtiles = %d;\n",
	  dec->numtiles, dec->numhtiles, dec->numvtiles));
	if (!(dec->tiles = jas_alloc2(dec->numtiles, sizeof(jpc_dec_tile_t)))) {
		return -1;
	}

	for (tileno = 0, tile = dec->tiles; tileno < dec->numtiles; ++tileno,
	  ++tile) {
		/* initialize all tiles with JPC_TILE_DONE so
		   jpc_dec_destroy() knows which ones need a
		   jpc_dec_tilefini() call; they are not actually
		   "done", of course */
		tile->state = JPC_TILE_DONE;
	}

	for (tileno = 0, tile = dec->tiles; tileno < dec->numtiles; ++tileno,
	  ++tile) {
		htileno = tileno % dec->numhtiles;
		vtileno = tileno / dec->numhtiles;
		tile->realmode = 0;
		tile->state = JPC_TILE_INIT;
		tile->xstart = JAS_MAX(dec->tilexoff + htileno * dec->tilewidth,
		  dec->xstart);
		tile->ystart = JAS_MAX(dec->tileyoff + vtileno * dec->tileheight,
		  dec->ystart);
		tile->xend = JAS_MIN(dec->tilexoff + (htileno + 1) *
		  dec->tilewidth, dec->xend);
		tile->yend = JAS_MIN(dec->tileyoff + (vtileno + 1) *
		  dec->tileheight, dec->yend);
		tile->numparts = 0;
		tile->partno = 0;
		tile->pkthdrstream = 0;
		tile->pkthdrstreampos = 0;
		tile->pptstab = 0;
		tile->cp = 0;
		tile->pi = 0;
		if (!(tile->tcomps = jas_alloc2(dec->numcomps,
		  sizeof(jpc_dec_tcomp_t)))) {
			return -1;
		}
		for (compno = 0, cmpt = dec->cmpts, tcomp = tile->tcomps;
		  compno < dec->numcomps; ++compno, ++cmpt, ++tcomp) {
			tcomp->rlvls = 0;
			tcomp->numrlvls = 0;
			tcomp->data = 0;
			tcomp->xstart = JPC_CEILDIV(tile->xstart, cmpt->hstep);
			tcomp->ystart = JPC_CEILDIV(tile->ystart, cmpt->vstep);
			tcomp->xend = JPC_CEILDIV(tile->xend, cmpt->hstep);
			tcomp->yend = JPC_CEILDIV(tile->yend, cmpt->vstep);
			tcomp->tsfb = 0;
		}
	}

	dec->pkthdrstreams = 0;

	/* We should expect to encounter other main header marker segments
	  or an SOT marker segment next. */
	dec->state = JPC_MH;

	return 0;
}